

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t
XXH3_len_129to240_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,size_t secretSize,XXH64_hash_t seed)

{
  XXH128_hash_t XVar1;
  XXH64_hash_t XVar2;
  XXH64_hash_t XVar3;
  int in_ESI;
  int i;
  int nbRounds;
  XXH128_hash_t acc;
  XXH128_hash_t h128;
  undefined1 in_stack_ffffffffffffff80 [16];
  XXH128_hash_t in_stack_ffffffffffffff90;
  XXH128_hash_t in_stack_ffffffffffffffa0;
  undefined4 local_50;
  
  for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
    in_stack_ffffffffffffffa0 =
         XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                       (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                       in_stack_ffffffffffffff80._0_8_);
  }
  XXH3_avalanche(0x1400fe);
  XXH3_avalanche(0x14010d);
  for (local_50 = 4; local_50 < in_ESI / 0x20; local_50 = local_50 + 1) {
    in_stack_ffffffffffffff90 =
         XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                       (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                       in_stack_ffffffffffffff80._0_8_);
  }
  XXH128_mix32B(in_stack_ffffffffffffffa0,(xxh_u8 *)in_stack_ffffffffffffff90.high64,
                (xxh_u8 *)in_stack_ffffffffffffff90.low64,in_stack_ffffffffffffff80._8_8_,
                in_stack_ffffffffffffff80._0_8_);
  XVar2 = XXH3_avalanche(0x14025b);
  XVar3 = XXH3_avalanche(0x14026d);
  XVar1.high64 = -XVar3;
  XVar1.low64 = XVar2;
  return XVar1;
}

Assistant:

XXH_NO_INLINE XXH128_hash_t XXH3_len_129to240_128b(
    const xxh_u8* XXH_RESTRICT input, size_t len,
    const xxh_u8* XXH_RESTRICT secret, size_t secretSize, XXH64_hash_t seed) {
  XXH_ASSERT(secretSize >= XXH3_SECRET_SIZE_MIN);
  (void)secretSize;
  XXH_ASSERT(128 < len && len <= XXH3_MIDSIZE_MAX);

  {
    XXH128_hash_t acc;
    int const nbRounds = (int)len / 32;
    int i;
    acc.low64 = len * XXH_PRIME64_1;
    acc.high64 = 0;
    for (i = 0; i < 4; i++) {
      acc = XXH128_mix32B(acc, input + (32 * i), input + (32 * i) + 16,
                          secret + (32 * i), seed);
    }
    acc.low64 = XXH3_avalanche(acc.low64);
    acc.high64 = XXH3_avalanche(acc.high64);
    XXH_ASSERT(nbRounds >= 4);
    for (i = 4; i < nbRounds; i++) {
      acc = XXH128_mix32B(acc, input + (32 * i), input + (32 * i) + 16,
                          secret + XXH3_MIDSIZE_STARTOFFSET + (32 * (i - 4)),
                          seed);
    }
    /* last bytes */
    acc = XXH128_mix32B(
        acc, input + len - 16, input + len - 32,
        secret + XXH3_SECRET_SIZE_MIN - XXH3_MIDSIZE_LASTOFFSET - 16,
        0ULL - seed);

    {
      XXH128_hash_t h128;
      h128.low64 = acc.low64 + acc.high64;
      h128.high64 = (acc.low64 * XXH_PRIME64_1) + (acc.high64 * XXH_PRIME64_4) +
                    ((len - seed) * XXH_PRIME64_2);
      h128.low64 = XXH3_avalanche(h128.low64);
      h128.high64 = (XXH64_hash_t)0 - XXH3_avalanche(h128.high64);
      return h128;
    }
  }
}